

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::or_operator::evaluate
          (or_operator *this,reference lhs,reference rhs,
          eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *context,error_code *param_4)

{
  bool bVar1;
  reference pbVar2;
  
  bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_null(lhs);
  if (bVar1) {
    bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_null(rhs)
    ;
    if (bVar1) {
      pbVar2 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               ::null_value(context);
      return pbVar2;
    }
  }
  bVar1 = is_false(lhs);
  if (!bVar1) {
    rhs = lhs;
  }
  return rhs;
}

Assistant:

reference evaluate(reference lhs, reference rhs, eval_context<Json>& context, std::error_code&) const override
            {
                if (lhs.is_null() && rhs.is_null())
                {
                    return context.null_value();
                }
                if (!is_false(lhs))
                {
                    return lhs;
                }
                else
                {
                    return rhs;
                }
            }